

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLEventsSourceTests.cpp
# Opt level: O3

void __thiscall
solitaire::events::SDLEventsSourceTests_ignoreEventIfSDLPollEventReturnsNotLeftMouseButtonEvent_Test
::TestBody(SDLEventsSourceTests_ignoreEventIfSDLPollEventReturnsNotLeftMouseButtonEvent_Test *this)

{
  int iVar1;
  TypedExpectation<int_(SDL_Event_&)> *pTVar2;
  ActionInterface<int_(SDL_Event_&)> *impl;
  undefined1 extraout_DL;
  pointer *__ptr;
  _Any_data *this_00;
  _Any_data *p_Var3;
  _func_int *message;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  undefined1 local_68 [8];
  MatcherBase<SDL_Event_&> local_60;
  MatcherBase<SDL_Event_&> local_48;
  int *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  this_00 = &local_88;
  p_Var3 = &local_88;
  local_48.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<SDL_Event&>::
       GetVTable<testing::internal::MatcherBase<SDL_Event&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_48.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_003242b8;
  SDL::WrapperMock::gmock_pollEvent
            ((MockSpec<int_(SDL_Event_&)> *)local_68,
             (this->super_SDLEventsSourceTests).sdlMock.rawPointer,(Matcher<SDL_Event_&> *)&local_48
            );
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<int_(SDL_Event_&)>::InternalExpectedAt
                     ((MockSpec<int_(SDL_Event_&)> *)local_68,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp"
                      ,0x2e,"*sdlMock","pollEvent(_)");
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = std::
             _Function_handler<int_(SDL_Event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp:46:57)>
             ::_M_manager;
  local_70 = std::
             _Function_handler<int_(SDL_Event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp:46:57)>
             ::_M_invoke;
  testing::internal::TypedExpectation<int_(SDL_Event_&)>::WillOnce
            (pTVar2,(Action<int_(SDL_Event_&)> *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  testing::internal::MatcherBase<SDL_Event_&>::~MatcherBase
            ((MatcherBase<SDL_Event_&> *)(local_68 + 8));
  testing::internal::MatcherBase<SDL_Event_&>::~MatcherBase(&local_48);
  local_48.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<SDL_Event&>::
       GetVTable<testing::internal::MatcherBase<SDL_Event&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_48.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_003242b8;
  SDL::WrapperMock::gmock_pollEvent
            ((MockSpec<int_(SDL_Event_&)> *)local_68,
             (this->super_SDLEventsSourceTests).sdlMock.rawPointer,(Matcher<SDL_Event_&> *)&local_48
            );
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<int_(SDL_Event_&)>::InternalExpectedAt
                     ((MockSpec<int_(SDL_Event_&)> *)local_68,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp"
                      ,0x34,"*sdlMock","pollEvent(_)");
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = std::
             _Function_handler<int_(SDL_Event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp:52:57)>
             ::_M_manager;
  local_70 = std::
             _Function_handler<int_(SDL_Event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp:52:57)>
             ::_M_invoke;
  testing::internal::TypedExpectation<int_(SDL_Event_&)>::WillOnce
            (pTVar2,(Action<int_(SDL_Event_&)> *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  testing::internal::MatcherBase<SDL_Event_&>::~MatcherBase
            ((MatcherBase<SDL_Event_&> *)(local_68 + 8));
  testing::internal::MatcherBase<SDL_Event_&>::~MatcherBase(&local_48);
  local_48.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<SDL_Event&>::
       GetVTable<testing::internal::MatcherBase<SDL_Event&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_48.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_003242b8;
  SDL::WrapperMock::gmock_pollEvent
            ((MockSpec<int_(SDL_Event_&)> *)local_68,
             (this->super_SDLEventsSourceTests).sdlMock.rawPointer,(Matcher<SDL_Event_&> *)&local_48
            );
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<int_(SDL_Event_&)>::InternalExpectedAt
                     ((MockSpec<int_(SDL_Event_&)> *)local_68,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp"
                      ,0x3a,"*sdlMock","pollEvent(_)");
  local_30 = (int *)operator_new(4);
  *local_30 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_28,local_30);
  impl = (ActionInterface<int_(SDL_Event_&)> *)operator_new(0x10);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_00325420;
  iVar1 = *local_30;
  *(int *)&impl[1]._vptr_ActionInterface = iVar1;
  *(int *)((long)&impl[1]._vptr_ActionInterface + 4) = iVar1;
  testing::Action<int_(SDL_Event_&)>::Action((Action<int_(SDL_Event_&)> *)&local_88,impl);
  testing::internal::TypedExpectation<int_(SDL_Event_&)>::WillOnce
            (pTVar2,(Action<int_(SDL_Event_&)> *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
    this_00 = p_Var3;
  }
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  testing::internal::MatcherBase<SDL_Event_&>::~MatcherBase
            ((MatcherBase<SDL_Event_&> *)(local_68 + 8));
  testing::internal::MatcherBase<SDL_Event_&>::~MatcherBase(&local_48);
  local_88._M_unused._M_object =
       SDLEventsSource::getEvent
                 ((Event *)&(this->super_SDLEventsSourceTests).eventsSource,
                  (SDLEventsSource *)this_00);
  local_88._M_pod_data[8] = extraout_DL;
  std::
  get<0ul,solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
            ((variant<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
              *)&local_88);
  testing::AssertionSuccess();
  if (local_68[0] == '\0') {
    testing::Message::Message((Message *)&local_88);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int *)0x298cf7;
    }
    else {
      message = *local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp"
               ,0x3b,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((Event *)local_88._M_unused._0_8_ != (Event *)0x0) {
      (**(code **)(*local_88._M_unused._M_object + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_68 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  return;
}

Assistant:

TEST_F(SDLEventsSourceTests, ignoreEventIfSDLPollEventReturnsNotLeftMouseButtonEvent) {
    EXPECT_CALL(*sdlMock, pollEvent(_)).WillOnce(Invoke([](auto& event) {
        event.type = SDL_MOUSEBUTTONDOWN;
        event.button.button = SDL_BUTTON_RIGHT;
        return 1;
    }));

    EXPECT_CALL(*sdlMock, pollEvent(_)).WillOnce(Invoke([](auto& event) {
        event.type = SDL_MOUSEBUTTONUP;
        event.button.button = SDL_BUTTON_RIGHT;
        return 1;
    }));

    EXPECT_CALL(*sdlMock, pollEvent(_)).WillOnce(Return(0));
    EXPECT_EQ(std::get<NoEvents>(eventsSource.getEvent()), NoEvents {});
}